

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O2

FT_Error tt_sbit_decoder_load_bit_aligned
                   (TT_SBitDecoder decoder,FT_Byte *p,FT_Byte *limit,FT_Int x_pos,FT_Int y_pos,
                   FT_UInt recurse_count)

{
  ushort uVar1;
  int iVar2;
  FT_Bitmap *pFVar3;
  uint uVar4;
  uint uVar5;
  FT_Error FVar6;
  byte bVar7;
  uint uVar8;
  byte *pbVar9;
  byte *pbVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  byte *pbVar14;
  uint uVar15;
  long lVar16;
  
  FVar6 = 3;
  if ((-1 < x_pos) && (-1 < y_pos)) {
    pFVar3 = decoder->bitmap;
    uVar8 = (uint)decoder->metrics->width;
    if ((uVar8 + x_pos <= pFVar3->width) &&
       (uVar1 = decoder->metrics->height, (uint)uVar1 + y_pos <= pFVar3->rows)) {
      uVar8 = decoder->bit_depth * uVar8;
      uVar15 = (uint)uVar1;
      if ((p + (uVar8 * uVar15 + 7 >> 3) <= limit) && (FVar6 = 0, uVar1 != 0 && uVar8 != 0)) {
        iVar2 = pFVar3->pitch;
        pbVar14 = pFVar3->buffer + (int)(((uint)x_pos >> 3) + y_pos * iVar2);
        uVar13 = x_pos & 7;
        uVar4 = 8 - uVar13;
        if (uVar8 < 8 - uVar13) {
          uVar4 = uVar8;
        }
        uVar11 = 0;
        uVar5 = 0;
        for (; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
          pbVar9 = p;
          pbVar10 = pbVar14;
          uVar12 = uVar8;
          if (uVar13 != 0) {
            if (uVar15 == uVar1) {
              uVar5 = (uint)*p;
              p = p + 1;
              uVar11 = uVar13;
            }
            else if ((int)uVar11 < (int)uVar4) {
              if (p < limit) {
                bVar7 = *p;
                p = p + 1;
                uVar5 = uVar5 | bVar7;
              }
              uVar11 = (uVar11 - uVar4) + 8;
            }
            else {
              uVar5 = (uVar5 & 0xffff) >> 8;
              uVar11 = uVar11 - uVar4;
            }
            *pbVar14 = *pbVar14 |
                       (byte)((uVar5 & 0xffff) >> ((byte)uVar11 & 0x1f)) &
                       (byte)(~(0xff << ((byte)uVar4 & 0x1f)) <<
                             (8 - ((char)uVar13 + (byte)uVar4) & 0x1f));
            uVar5 = uVar5 << 8;
            pbVar9 = p;
            pbVar10 = pbVar14 + 1;
            uVar12 = uVar8 - uVar4;
          }
          lVar16 = 0;
          while( true ) {
            bVar7 = (byte)uVar11;
            if ((int)uVar12 < 8) break;
            uVar5 = uVar5 & 0xffff | (uint)pbVar9[lVar16];
            pbVar10[lVar16] = pbVar10[lVar16] | (byte)(uVar5 >> (bVar7 & 0x1f));
            uVar5 = uVar5 << 8;
            uVar12 = uVar12 - 8;
            lVar16 = lVar16 + 1;
          }
          p = pbVar9 + lVar16;
          if (0 < (int)uVar12) {
            if ((int)uVar11 < (int)uVar12) {
              if (p < limit) {
                p = pbVar9 + lVar16 + 1;
                uVar5 = uVar5 | pbVar9[lVar16];
              }
              pbVar10[lVar16] =
                   pbVar10[lVar16] |
                   (byte)(0xff00 >> ((byte)uVar12 & 0x1f)) &
                   (byte)((uVar5 & 0xffff) >> (bVar7 & 0x1f));
              uVar11 = (uVar11 - uVar12) + 8;
              uVar5 = uVar5 << 8;
            }
            else {
              pbVar10[lVar16] =
                   pbVar10[lVar16] |
                   (byte)(0xff00 >> ((byte)uVar12 & 0x1f)) &
                   (byte)((uVar5 & 0xffff) >> (bVar7 & 0x1f));
              uVar11 = uVar11 - uVar12;
            }
          }
          pbVar14 = pbVar14 + iVar2;
        }
        FVar6 = 0;
      }
    }
  }
  return FVar6;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_bit_aligned( TT_SBitDecoder  decoder,
                                    FT_Byte*        p,
                                    FT_Byte*        limit,
                                    FT_Int          x_pos,
                                    FT_Int          y_pos,
                                    FT_UInt         recurse_count )
  {
    FT_Error    error = FT_Err_Ok;
    FT_Byte*    line;
    FT_Int      pitch, width, height, line_bits, h, nbits;
    FT_UInt     bit_height, bit_width;
    FT_Bitmap*  bitmap;
    FT_UShort   rval;

    FT_UNUSED( recurse_count );


    /* check that we can write the glyph into the bitmap */
    bitmap     = decoder->bitmap;
    bit_width  = bitmap->width;
    bit_height = bitmap->rows;
    pitch      = bitmap->pitch;
    line       = bitmap->buffer;

    width  = decoder->metrics->width;
    height = decoder->metrics->height;

    line_bits = width * decoder->bit_depth;

    if ( x_pos < 0 || (FT_UInt)( x_pos + width ) > bit_width   ||
         y_pos < 0 || (FT_UInt)( y_pos + height ) > bit_height )
    {
      FT_TRACE1(( "tt_sbit_decoder_load_bit_aligned:"
                  " invalid bitmap dimensions\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( p + ( ( line_bits * height + 7 ) >> 3 ) > limit )
    {
      FT_TRACE1(( "tt_sbit_decoder_load_bit_aligned: broken bitmap\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( !line_bits || !height )
    {
      /* nothing to do */
      goto Exit;
    }

    /* now do the blit */

    /* adjust `line' to point to the first byte of the bitmap */
    line  += y_pos * pitch + ( x_pos >> 3 );
    x_pos &= 7;

    /* the higher byte of `rval' is used as a buffer */
    rval  = 0;
    nbits = 0;

    for ( h = height; h > 0; h--, line += pitch )
    {
      FT_Byte*  pwrite = line;
      FT_Int    w      = line_bits;


      /* handle initial byte (in target bitmap) specially if necessary */
      if ( x_pos )
      {
        w = ( line_bits < 8 - x_pos ) ? line_bits : 8 - x_pos;

        if ( h == height )
        {
          rval  = *p++;
          nbits = x_pos;
        }
        else if ( nbits < w )
        {
          if ( p < limit )
            rval |= *p++;
          nbits += 8 - w;
        }
        else
        {
          rval  >>= 8;
          nbits  -= w;
        }

        *pwrite++ |= ( ( rval >> nbits ) & 0xFF ) &
                     ( ~( 0xFFU << w ) << ( 8 - w - x_pos ) );
        rval     <<= 8;

        w = line_bits - w;
      }

      /* handle medial bytes */
      for ( ; w >= 8; w -= 8 )
      {
        rval      |= *p++;
        *pwrite++ |= ( rval >> nbits ) & 0xFF;

        rval <<= 8;
      }

      /* handle final byte if necessary */
      if ( w > 0 )
      {
        if ( nbits < w )
        {
          if ( p < limit )
            rval |= *p++;
          *pwrite |= ( ( rval >> nbits ) & 0xFF ) & ( 0xFF00U >> w );
          nbits   += 8 - w;

          rval <<= 8;
        }
        else
        {
          *pwrite |= ( ( rval >> nbits ) & 0xFF ) & ( 0xFF00U >> w );
          nbits   -= w;
        }
      }
    }

  Exit:
    if ( !error )
      FT_TRACE3(( "tt_sbit_decoder_load_bit_aligned: loaded\n" ));
    return error;
  }